

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuItem>::emplace<QDBusMenuItem>
          (QMovableArrayOps<QDBusMenuItem> *this,qsizetype i,QDBusMenuItem *args)

{
  QDBusMenuItem **ppQVar1;
  qsizetype *pqVar2;
  QDBusMenuItem *pQVar3;
  int iVar4;
  Data *pDVar5;
  long lVar6;
  QDBusMenuItem *pQVar7;
  QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
  *pQVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QVariantMap aQStack_40 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0064ef05:
    iVar4 = args->m_id;
    aQStack_40[0].d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
          )(args->m_properties).d.d.ptr;
    (args->m_properties).d.d.ptr =
         (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
          *)0x0;
    bVar9 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
            size != 0;
    QArrayDataPointer<QDBusMenuItem>::detachAndGrow
              ((QArrayDataPointer<QDBusMenuItem> *)this,(uint)(i == 0 && bVar9),1,
               (QDBusMenuItem **)0x0,(QArrayDataPointer<QDBusMenuItem> *)0x0);
    pQVar7 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
             ptr;
    if (i == 0 && bVar9) {
      pQVar7[-1].m_id = iVar4;
      pQVar7[-1].m_properties.d.d.ptr =
           (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
            *)aQStack_40[0].d.d.ptr;
      ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuItem>).
                 super_QArrayDataPointer<QDBusMenuItem>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    else {
      pQVar3 = pQVar7 + i;
      memmove(pQVar3 + 1,pQVar7 + i,
              ((this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
               size - i) * 0x10);
      pQVar3->m_id = iVar4;
      (pQVar3->m_properties).d.d.ptr =
           (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
            *)aQStack_40[0].d.d.ptr;
    }
    aQStack_40[0].d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
            )0x0;
    pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
              size;
    *pqVar2 = *pqVar2 + 1;
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&aQStack_40[0].d);
  }
  else {
    lVar6 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
            size;
    if ((lVar6 == i && pDVar5 != (Data *)0x0) &&
       ((pDVar5->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QDBusMenuItem>).
                      super_QArrayDataPointer<QDBusMenuItem>.ptr -
               ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) +
        lVar6)) {
      pQVar7 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
               ptr;
      pQVar7[lVar6].m_id = args->m_id;
      pQVar8 = (args->m_properties).d.d.ptr;
      (args->m_properties).d.d.ptr =
           (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
            *)0x0;
      pQVar7[lVar6].m_properties.d.d.ptr = pQVar8;
    }
    else {
      if (((i != 0) || (pDVar5 == (Data *)0x0)) ||
         ((QDBusMenuItem *)
          ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.ptr))
      goto LAB_0064ef05;
      pQVar7 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
               ptr;
      pQVar7[-1].m_id = args->m_id;
      pQVar8 = (args->m_properties).d.d.ptr;
      (args->m_properties).d.d.ptr =
           (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
            *)0x0;
      pQVar7[-1].m_properties.d.d.ptr = pQVar8;
      ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuItem>).
                 super_QArrayDataPointer<QDBusMenuItem>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
              size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }